

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O3

bool __thiscall
S2PolylineSimplifier::AvoidDisc
          (S2PolylineSimplifier *this,S2Point *p,S1ChordAngle r,bool disc_on_left)

{
  double dVar1;
  double lo;
  byte bVar2;
  double hi;
  S1Interval SVar3;
  S1Interval target;
  S1Interval SStack_48;
  double local_38;
  S1Interval local_28;
  
  local_38 = GetSemiwidth(this,p,r,1);
  if (3.141592653589793 <= local_38) {
    (this->window_).bounds_.c_[0] = 3.141592653589793;
    (this->window_).bounds_.c_[1] = -3.141592653589793;
    bVar2 = 0;
  }
  else {
    dVar1 = GetAngle(this,p);
    hi = dVar1 + *(double *)(&DAT_00240330 + (ulong)(0.0 < dVar1) * 8);
    lo = dVar1;
    if (disc_on_left) {
      lo = hi;
      hi = dVar1;
    }
    S1Interval::S1Interval(&SStack_48,lo,hi);
    local_28 = S1Interval::Expanded(&SStack_48,-local_38);
    SVar3 = S1Interval::Intersection(&this->window_,&local_28);
    *(Vector2_d *)(this->window_).bounds_.c_ = SVar3.bounds_.c_;
    bVar2 = -(SVar3.bounds_.c_[0] != 3.141592653589793) |
            -(SVar3.bounds_.c_[1] != -3.141592653589793);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool S2PolylineSimplifier::AvoidDisc(const S2Point& p, S1ChordAngle r,
                                     bool disc_on_left) {
  // Expand the interval by the maximum error from all sources.  This
  // guarantees that the final output edge will avoid the given disc.
  double semiwidth = GetSemiwidth(p, r, 1 /*round up*/);
  if (semiwidth >= M_PI) {
    // The avoidance disc contains "src", so it is impossible to avoid.
    window_ = S1Interval::Empty();
    return false;
  }
  double center = GetAngle(p);
  double opposite = (center > 0) ? center - M_PI : center + M_PI;
  S1Interval target = (disc_on_left ? S1Interval(opposite, center) :
                       S1Interval(center, opposite));
  window_ = window_.Intersection(target.Expanded(-semiwidth));
  return !window_.is_empty();
}